

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

ostream * tcu::operator<<(ostream *stream,Vector<int,_4> *vec)

{
  int i;
  long lVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
    }
    std::ostream::operator<<(stream,vec->m_data[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const tcu::Vector<T, Size>& vec)
{
	stream << "(";
	for (int i = 0; i < Size; i++)
	{
		if (i != 0)
			stream << ", ";
		stream << vec.m_data[i];
	}
	stream << ")";
	return stream;
}